

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-bool.cpp
# Opt level: O2

void __thiscall BoolLinearLE<0>::wakeup(BoolLinearLE<0> *this,int i,int param_2)

{
  if (i < (int)(this->x).sz) {
    Tint::operator++(&this->ones,0);
  }
  Propagator::pushInQueue(&this->super_Propagator);
  return;
}

Assistant:

void wakeup(int i, int /*c*/) override {
		if (i < static_cast<int>(x.size())) {
			ones++;
		}
		pushInQueue();
	}